

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

void cmListFileLexerSetToken(cmListFileLexer *lexer,char *text,int length)

{
  char *pcVar1;
  int length_local;
  char *text_local;
  cmListFileLexer *lexer_local;
  
  (lexer->token).line = lexer->line;
  (lexer->token).column = lexer->column;
  if ((lexer->token).text != (char *)0x0) {
    if ((text != (char *)0x0) && (length < lexer->size)) {
      strcpy((lexer->token).text,text);
      (lexer->token).length = length;
      return;
    }
    free((lexer->token).text);
    (lexer->token).text = (char *)0x0;
    lexer->size = 0;
  }
  if (text == (char *)0x0) {
    (lexer->token).length = 0;
  }
  else {
    pcVar1 = strdup(text);
    (lexer->token).text = pcVar1;
    (lexer->token).length = length;
    lexer->size = length + 1;
  }
  return;
}

Assistant:

static void cmListFileLexerSetToken(cmListFileLexer* lexer, const char* text,
                                    int length)
{
  /* Set the token line and column number.  */
  lexer->token.line = lexer->line;
  lexer->token.column = lexer->column;

  /* Use the same buffer if possible.  */
  if (lexer->token.text) {
    if (text && length < lexer->size) {
      strcpy(lexer->token.text, text);
      lexer->token.length = length;
      return;
    }
    free(lexer->token.text);
    lexer->token.text = 0;
    lexer->size = 0;
  }

  /* Need to extend the buffer.  */
  if (text) {
    lexer->token.text = strdup(text);
    lexer->token.length = length;
    lexer->size = length + 1;
  } else {
    lexer->token.length = 0;
  }
}